

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::CallNative(SQVM *this,SQNativeClosure *nclosure,SQInteger nargs,SQInteger newbase,
                SQObjectPtr *retval,bool *suspend)

{
  SQObjectType SVar1;
  long lVar2;
  bool bVar3;
  SQInteger SVar4;
  char *s;
  SQUnsignedInteger SVar5;
  SQUnsignedInteger SVar6;
  SQObjectPtr *pSVar7;
  
  if (99 < this->_nnativecalls) {
    s = "Native stack overflow";
LAB_00129f51:
    Raise_Error(this,s);
    return false;
  }
  lVar2 = nclosure->_nparamscheck;
  if ((lVar2 != 0) &&
     ((0 < lVar2 && lVar2 != nargs || ((-nargs != lVar2 && nargs <= -lVar2) && lVar2 < 0)))) {
    s = "wrong number of parameters";
    goto LAB_00129f51;
  }
  SVar6 = (nclosure->_typecheck)._size;
  if (SVar6 != 0) {
    if (nargs < (long)SVar6) {
      SVar6 = nargs;
    }
    pSVar7 = (this->_stack)._vals + newbase;
    SVar5 = 0;
    if ((long)SVar6 < 1) {
      SVar6 = SVar5;
    }
    for (; SVar6 != SVar5; SVar5 = SVar5 + 1) {
      lVar2 = (nclosure->_typecheck)._vals[SVar5];
      if ((lVar2 != -1) &&
         (SVar1 = (pSVar7->super_SQObject)._type, ((SQObjectType)lVar2 & SVar1) == 0)) {
        Raise_ParamTypeError(this,SVar5,lVar2,(ulong)SVar1);
        return false;
      }
      pSVar7 = pSVar7 + 1;
    }
  }
  bVar3 = EnterFrame(this,newbase,nargs + newbase + nclosure->_noutervalues,false);
  if (!bVar3) {
    return false;
  }
  SQObjectPtr::operator=(&this->ci->_closure,nclosure);
  SVar5 = 0;
  SVar6 = nclosure->_noutervalues;
  if ((long)nclosure->_noutervalues < 1) {
    SVar6 = SVar5;
  }
  while (SVar6 != 0) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)
               ((long)&(this->_stack)._vals[newbase + nargs].super_SQObject._type + SVar5),
               (SQObjectPtr *)((long)&(nclosure->_outervalues->super_SQObject)._type + SVar5));
    SVar5 = SVar5 + 0x10;
    SVar6 = SVar6 - 1;
  }
  if (nclosure->_env != (SQWeakRef *)0x0) {
    SQObjectPtr::operator=((this->_stack)._vals + newbase,&nclosure->_env->_obj);
  }
  this->_nnativecalls = this->_nnativecalls + 1;
  SVar4 = (*nclosure->_function)(this);
  this->_nnativecalls = this->_nnativecalls + -1;
  *suspend = false;
  if (SVar4 == -0x29a) {
    *suspend = true;
  }
  else {
    if (SVar4 < 0) {
      LeaveFrame(this);
      Raise_Error(this,&this->_lasterror);
      return false;
    }
    if (SVar4 == 0) {
      SQObjectPtr::Null(retval);
      goto LAB_0012a0a2;
    }
  }
  SQObjectPtr::operator=(retval,(this->_stack)._vals + this->_top + -1);
LAB_0012a0a2:
  LeaveFrame(this);
  return true;
}

Assistant:

bool SQVM::CallNative(SQNativeClosure *nclosure, SQInteger nargs, SQInteger newbase, SQObjectPtr &retval, bool &suspend)
{
    SQInteger nparamscheck = nclosure->_nparamscheck;
    SQInteger newtop = newbase + nargs + nclosure->_noutervalues;

    if (_nnativecalls + 1 > MAX_NATIVE_CALLS) {
        Raise_Error(_SC("Native stack overflow"));
        return false;
    }

    if(nparamscheck && (((nparamscheck > 0) && (nparamscheck != nargs)) ||
        ((nparamscheck < 0) && (nargs < (-nparamscheck)))))
    {
        Raise_Error(_SC("wrong number of parameters"));
        return false;
    }

    SQInteger tcs;
    SQIntVec &tc = nclosure->_typecheck;
    if((tcs = tc.size())) {
        for(SQInteger i = 0; i < nargs && i < tcs; i++) {
            if((tc._vals[i] != -1) && !(type(_stack._vals[newbase+i]) & tc._vals[i])) {
                Raise_ParamTypeError(i,tc._vals[i],type(_stack._vals[newbase+i]));
                return false;
            }
        }
    }

    if(!EnterFrame(newbase, newtop, false)) return false;
    ci->_closure  = nclosure;

    SQInteger outers = nclosure->_noutervalues;
    for (SQInteger i = 0; i < outers; i++) {
        _stack._vals[newbase+nargs+i] = nclosure->_outervalues[i];
    }
    if(nclosure->_env) {
        _stack._vals[newbase] = nclosure->_env->_obj;
    }

    _nnativecalls++;
    SQInteger ret = (nclosure->_function)(this);
    _nnativecalls--;

    suspend = false;
    if (ret == SQ_SUSPEND_FLAG) {
        suspend = true;
    }
    else if (ret < 0) {
        LeaveFrame();
        Raise_Error(_lasterror);
        return false;
    }
    if(ret) {
        retval = _stack._vals[_top-1];
    }
    else {
        retval.Null();
    }
    //retval = ret ? _stack._vals[_top-1] : _null_;
    LeaveFrame();
    return true;
}